

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O3

void la_dgemm_ntoe(int m,int n,int k,double alpha,double *a,int lda,double *b,int ldb,double beta,
                  double *c,int ldc,double *d,int ldd)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1cf,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d0,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d1,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (a == d) {
    __assert_fail("a != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d2,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == d) {
    __assert_fail("b != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d3,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == d) {
    __assert_fail("c != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d4,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1d5,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (-1 < n) {
    if (k < 0) {
      __assert_fail("k >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1d7,
                    "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((lda < 1) || (lda < m)) {
      __assert_fail("lda >= 1 && lda >= m",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1d8,
                    "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((ldb < 1) || (ldb < n)) {
      __assert_fail("ldb >= 1 && ldb >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1d9,
                    "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldc) && (n <= ldc)) {
      if ((0 < ldd) && (n <= ldd)) {
        if (m != 0) {
          uVar5 = 0;
          do {
            if (n != 0) {
              uVar2 = 0;
              pdVar3 = b;
              do {
                lVar1 = uVar2 + uVar5 * (uint)ldc;
                dVar6 = c[lVar1] * beta;
                if (k != 0) {
                  uVar4 = 0;
                  do {
                    dVar6 = dVar6 + a[uVar4] * alpha * pdVar3[uVar4];
                    uVar4 = uVar4 + 1;
                  } while ((uint)k != uVar4);
                }
                d[lVar1] = dVar6;
                uVar2 = uVar2 + 1;
                pdVar3 = pdVar3 + (uint)ldb;
              } while (uVar2 != (uint)n);
            }
            uVar5 = uVar5 + 1;
            a = a + (uint)lda;
          } while (uVar5 != (uint)m);
        }
        return;
      }
      __assert_fail("ldd >= 1 && ldd >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1db,
                    "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1da,
                  "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x1d6,
                "void la_dgemm_ntoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_ntoe(
        int m, int n, int k,
        double alpha,
        const double *a, int lda,
        const double *b, int ldb,
        double beta,
        const double *c, int ldc,
        double *d, int ldd)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != d);
    assert(b != d);
    assert(c != d);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= m);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);
    assert(ldd >= 1 && ldd >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double dij = beta * c[i_ * ldc + j_];
            for (int k_ = 0; k_ < k; k_++) {
                dij += alpha * a[i_ * lda + k_] * b[j_ * ldb + k_];
            }
            d[i_ * ldc + j_] = dij;
        }
    }
}